

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClear
          (MessageGenerator *this,Printer *printer)

{
  pointer *pppFVar1;
  Descriptor *pDVar2;
  pointer ppFVar3;
  FieldDescriptor *field_00;
  iterator __position;
  undefined8 uVar4;
  pointer pvVar5;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar6;
  _Base_ptr this_00;
  bool bVar7;
  bool bVar8;
  FileOptions_OptimizeMode FVar9;
  uint uVar10;
  int iVar11;
  undefined7 extraout_var;
  LogMessage *pLVar12;
  FieldGenerator *pFVar13;
  ulong uVar14;
  int iVar15;
  uint32_t uVar16;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *pFVar17;
  FieldDescriptor *field_01;
  FieldDescriptor **field;
  pointer ppFVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  int *in_R8;
  cpp *this_01;
  cpp *field_02;
  MessageGenerator *this_02;
  FieldDescriptor **field_1;
  undefined4 uVar22;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar23;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  Hex hex;
  int cached_has_word_index;
  string chunk_mask_str;
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  Formatter format;
  ColdChunkSkipper cold_skipper;
  undefined1 local_224 [16];
  undefined4 local_214;
  Printer *local_210;
  undefined1 local_208 [32];
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  local_1e8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_1d0;
  ulong local_1c8;
  vector<int,_std::allocator<int>_> *local_1c0;
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [44];
  uint local_17c;
  Formatter local_178;
  Options *local_140;
  _Base_ptr local_138;
  ColdChunkSkipper local_130;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  pDVar2 = this->descriptor_;
  local_140 = &this->options_;
  local_210 = printer;
  FVar9 = GetOptimizeFor(*(FileDescriptor **)(pDVar2 + 0x10),local_140,(bool *)0x0);
  if (((FVar9 == FileOptions_OptimizeMode_LITE_RUNTIME) || (*(int *)(pDVar2 + 0x78) != 0)) ||
     (*(int *)(pDVar2 + 4) != 0)) {
    local_178.printer_ = local_210;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_178.vars_._M_t,&(this->variables_)._M_t);
    Formatter::operator()<>
              (&local_178,
               "void $classname$::Clear() {\n// @@protoc_insertion_point(message_clear_start:$full_name$)\n"
              );
    io::Printer::Indent(local_178.printer_);
    Formatter::operator()<>
              (&local_178,
               "$uint32$ cached_has_bits = 0;\n// Prevent compiler warnings about cached_has_bits being unused\n(void) cached_has_bits;\n\n"
              );
    if (0 < *(int *)(this->descriptor_ + 0x78)) {
      Formatter::operator()<>(&local_178,"_extensions_.Clear();\n");
    }
    ppFVar18 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar3 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    iVar19 = 0;
    local_224._4_8_ = this;
    if (ppFVar18 == ppFVar3) {
      local_214 = 0;
    }
    else {
      do {
        bVar7 = CanInitializeByZeroing(*ppFVar18);
        uVar14 = CONCAT71(extraout_var,bVar7);
        if (bVar7) {
          uVar10 = EstimateAlignmentSize(*ppFVar18);
          uVar14 = (ulong)uVar10;
          iVar19 = iVar19 + uVar10;
        }
        ppFVar18 = ppFVar18 + 1;
      } while (ppFVar18 != ppFVar3);
      local_214 = (undefined4)CONCAT71((int7)(uVar14 >> 8),4 < iVar19);
    }
    uVar22 = 0;
    uVar23 = 0;
    local_1e8.
    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *)0x0;
    local_1e8.
    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *)0x0;
    local_1e8.
    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *)0x0;
    ppFVar18 = (((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)(local_224._4_8_ + 0x140))->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_1c0 = (vector<int,_std::allocator<int>_> *)
                (((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)(local_224._4_8_ + 0x140))->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if ((vector<int,_std::allocator<int>_> *)ppFVar18 != local_1c0) {
      iVar19 = 0;
      do {
        uVar4 = local_224._4_8_;
        pFVar17 = *ppFVar18;
        iVar11 = iVar19;
        local_130.chunks_ =
             (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              *)pFVar17;
        if (local_1e8.
            super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_1e8.
            super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002a9f1b:
          iVar20 = iVar11;
          if (local_1e8.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_1e8.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            ::_M_realloc_insert<>
                      (&local_1e8,
                       (iterator)
                       local_1e8.
                       super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            uVar22 = extraout_XMM0_Da_01;
            uVar23 = extraout_XMM0_Db_01;
          }
          else {
            uVar22 = 0;
            uVar23 = 0;
            ((local_1e8.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ((local_1e8.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ((local_1e8.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1e8.
            super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_1e8.
                 super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          field_00 = local_1e8.
                     super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1];
          iVar11 = HasBitIndex((MessageGenerator *)local_224._4_8_,field_00);
          iVar20 = iVar11 + 7;
          if (-1 < iVar11) {
            iVar20 = iVar11;
          }
          iVar20 = iVar20 >> 3;
          if (iVar11 == -1) {
            iVar20 = -1;
          }
          iVar11 = HasBitIndex((MessageGenerator *)uVar4,pFVar17);
          iVar15 = iVar11 + 7;
          if (-1 < iVar11) {
            iVar15 = iVar11;
          }
          iVar15 = iVar15 >> 3;
          if (iVar11 == -1) {
            iVar15 = -1;
          }
          iVar11 = 0;
          if ((iVar20 != iVar15) ||
             (((~(byte)pFVar17[1] & 0x60) == 0) != ((~(byte)field_00[1] & 0x60) == 0)))
          goto LAB_002a9f1b;
          bVar7 = CanInitializeByZeroing(field_00);
          bVar8 = CanInitializeByZeroing(pFVar17);
          uVar22 = extraout_XMM0_Da;
          uVar23 = extraout_XMM0_Db;
          iVar20 = iVar19 + 1;
          if (bVar7 != bVar8) {
            bVar7 = CanInitializeByZeroing(field_00);
            uVar22 = extraout_XMM0_Da_00;
            uVar23 = extraout_XMM0_Db_00;
            if ((bVar7 & (iVar19 == 0 | (byte)local_214)) == 0) goto LAB_002a9f1b;
          }
        }
        iVar19 = iVar20;
        __position._M_current =
             local_1e8.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            local_1e8.
            super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      *)(local_1e8.
                         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1),__position,
                     (FieldDescriptor **)&local_130);
          uVar22 = extraout_XMM0_Da_02;
          uVar23 = extraout_XMM0_Db_02;
        }
        else {
          *__position._M_current = (FieldDescriptor *)local_130.chunks_;
          pppFVar1 = &local_1e8.
                      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppFVar1 = *pppFVar1 + 1;
        }
        ppFVar18 = ppFVar18 + 1;
      } while ((vector<int,_std::allocator<int>_> *)ppFVar18 != local_1c0);
    }
    this_02 = (MessageGenerator *)local_224._4_8_;
    local_1c0 = (vector<int,_std::allocator<int>_> *)(local_224._4_8_ + 0x158);
    anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
              (&local_130,local_140,&local_1e8,local_1c0,(double)CONCAT44(uVar23,uVar22));
    local_224._0_4_ = -1;
    if (local_1e8.
        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_1e8.
        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_138 = (_Base_ptr)((long)this_02 + 0x120);
      local_1c8 = 0;
      do {
        pvVar5 = local_1e8.
                 super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_208._0_8_ = (FieldDescriptor *)(local_208 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"");
        local_1b8 = (undefined1  [8])local_210;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_1b0,&local_130.variables_._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_1b0);
        if ((FieldDescriptor *)local_208._0_8_ != (FieldDescriptor *)(local_208 + 0x10)) {
          operator_delete((void *)local_208._0_8_);
        }
        local_1d0 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)((long)pvVar5 + local_1c8 * 0x18);
        ppFVar18 = (local_1d0->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppFVar3 = (local_1d0->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (ppFVar18 == ppFVar3) {
          this_01 = (cpp *)0x0;
          field_02 = (cpp *)0x0;
        }
        else {
          field_02 = (cpp *)0x0;
          this_01 = (cpp *)0x0;
          bVar7 = false;
          do {
            bVar8 = CanInitializeByZeroing(*ppFVar18);
            if (bVar8) {
              if (bVar7) {
                internal::LogMessage::LogMessage
                          (&local_68,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                           ,0xccd);
                pLVar12 = internal::LogMessage::operator<<
                                    (&local_68,"CHECK failed: !saw_non_zero_init: ");
                internal::LogFinisher::operator=((LogFinisher *)local_1b8,pLVar12);
                internal::LogMessage::~LogMessage(&local_68);
              }
              this_01 = (cpp *)*ppFVar18;
              if (field_02 == (cpp *)0x0) {
                field_02 = this_01;
              }
            }
            else {
              bVar7 = true;
            }
            ppFVar18 = ppFVar18 + 1;
          } while (ppFVar18 != ppFVar3);
        }
        pvVar6 = local_1d0;
        ppFVar18 = (local_1d0->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        iVar19 = HasBitIndex((MessageGenerator *)local_224._4_8_,*ppFVar18);
        this_02 = (MessageGenerator *)local_224._4_8_;
        if (iVar19 == -1) {
          local_17c = 0;
        }
        else {
          ppFVar3 = (pvVar6->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          if ((ulong)((long)ppFVar3 - (long)ppFVar18) < 9) {
            local_17c = 0;
          }
          else {
            local_17c = (uint)CONCAT71((int7)((ulong)ppFVar3 >> 8),
                                       this_01 != (cpp *)ppFVar3[-1] | (byte)local_214);
          }
        }
        pFVar17 = extraout_RDX;
        if ((local_17c & 1) != 0) {
          uVar10 = anon_unknown_0::GenChunkMask(local_1d0,local_1c0);
          hex.value = (ulong)uVar10;
          hex._8_8_ = 8;
          strings::AlphaNum::AlphaNum((AlphaNum *)local_1b8,hex);
          local_208._0_8_ = (FieldDescriptor *)(local_208 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_208,local_1b8,(Descriptor *)((long)local_1b0 + (long)local_1b8)
                    );
          if (uVar10 == 0) {
            bVar7 = true;
          }
          else {
            iVar19 = 0;
            uVar16 = uVar10;
            do {
              iVar19 = iVar19 + (uVar16 & 1);
              bVar7 = 1 < uVar16;
              uVar16 = uVar16 >> 1;
            } while (bVar7);
            bVar7 = iVar19 < 2;
          }
          if (bVar7) {
            internal::LogMessage::LogMessage
                      (&local_a0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xce7);
            pLVar12 = internal::LogMessage::operator<<
                                (&local_a0,"CHECK failed: (2) <= (popcnt(chunk_mask)): ");
            internal::LogFinisher::operator=((LogFinisher *)local_1b8,pLVar12);
            internal::LogMessage::~LogMessage(&local_a0);
          }
          uVar21 = 0;
          if (uVar10 != 0) {
            do {
              uVar21 = uVar21 + (uVar10 & 1);
              bVar7 = 1 < uVar10;
              uVar10 = uVar10 >> 1;
            } while (bVar7);
            uVar21 = (uint)(8 < (int)uVar21);
          }
          if ((char)uVar21 != '\0') {
            internal::LogMessage::LogMessage
                      (&local_d8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xce8);
            pLVar12 = internal::LogMessage::operator<<
                                (&local_d8,"CHECK failed: (8) >= (popcnt(chunk_mask)): ");
            internal::LogFinisher::operator=((LogFinisher *)local_1b8,pLVar12);
            internal::LogMessage::~LogMessage(&local_d8);
          }
          uVar22 = local_224._0_4_;
          iVar11 = HasBitIndex(this_02,*(local_1d0->
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start);
          iVar19 = iVar11 + 0x1f;
          if (-1 < iVar11) {
            iVar19 = iVar11;
          }
          iVar19 = iVar19 >> 5;
          if (iVar11 == -1) {
            iVar19 = -1;
          }
          if (uVar22 != iVar19) {
            local_224._0_4_ = iVar19;
            Formatter::operator()
                      (&local_178,"cached_has_bits = _has_bits_[$1$];\n",(int *)local_224);
          }
          Formatter::operator()
                    (&local_178,"if (cached_has_bits & 0x$1$u) {\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208)
          ;
          io::Printer::Indent(local_178.printer_);
          pFVar17 = extraout_RDX_00;
          if ((FieldDescriptor *)local_208._0_8_ != (FieldDescriptor *)(local_208 + 0x10)) {
            operator_delete((void *)local_208._0_8_);
            pFVar17 = extraout_RDX_01;
          }
        }
        if (field_02 != (cpp *)0x0) {
          if (field_02 == this_01) {
            pFVar13 = FieldGeneratorMap::get
                                ((FieldGeneratorMap *)local_138,(FieldDescriptor *)field_02);
            (*pFVar13->_vptr_FieldGenerator[0xb])(pFVar13,local_210);
          }
          else {
            FieldName_abi_cxx11_((string *)local_1b8,field_02,pFVar17);
            FieldName_abi_cxx11_((string *)local_208,this_01,field_01);
            Formatter::operator()
                      (&local_178,
                       "::memset(&$1$_, 0, static_cast<size_t>(\n    reinterpret_cast<char*>(&$2$_) -\n    reinterpret_cast<char*>(&$1$_)) + sizeof($2$_));\n"
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1b8,(string *)local_208);
            if ((FieldDescriptor *)local_208._0_8_ != (FieldDescriptor *)(local_208 + 0x10)) {
              operator_delete((void *)local_208._0_8_);
            }
            if (local_1b8 != (undefined1  [8])local_1a8) {
              operator_delete((void *)local_1b8);
            }
          }
        }
        this_00 = local_138;
        ppFVar3 = (local_1d0->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        for (ppFVar18 = (local_1d0->
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_start; ppFVar18 != ppFVar3;
            ppFVar18 = ppFVar18 + 1) {
          bVar7 = CanInitializeByZeroing(*ppFVar18);
          if (!bVar7) {
            pFVar17 = *ppFVar18;
            iVar19 = HasBitIndex(this_02,pFVar17);
            if (iVar19 == -1) {
              bVar7 = false;
            }
            else {
              if (*(once_flag **)(pFVar17 + 0x18) != (once_flag *)0x0) {
                local_1b8 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
                local_208._0_8_ = pFVar17;
                std::
                call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                          (*(once_flag **)(pFVar17 + 0x18),
                           (_func_void_FieldDescriptor_ptr **)local_1b8,
                           (FieldDescriptor **)local_208);
              }
              bVar7 = true;
              if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar17[2] * 4) != 10)
              {
                pFVar17 = *ppFVar18;
                if (*(once_flag **)(pFVar17 + 0x18) != (once_flag *)0x0) {
                  local_1b8 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
                  local_208._0_8_ = pFVar17;
                  std::
                  call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                            (*(once_flag **)(pFVar17 + 0x18),
                             (_func_void_FieldDescriptor_ptr **)local_1b8,
                             (FieldDescriptor **)local_208);
                }
                bVar7 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar17[2] * 4)
                        == 9;
              }
            }
            if (bVar7) {
              anon_unknown_0::PrintPresenceCheck
                        (&local_178,*ppFVar18,local_1c0,(Printer *)local_224,in_R8);
            }
            pFVar13 = FieldGeneratorMap::get((FieldGeneratorMap *)this_00,*ppFVar18);
            (*pFVar13->_vptr_FieldGenerator[0xb])(pFVar13,local_210);
            if (bVar7) {
              io::Printer::Outdent(local_178.printer_);
              Formatter::operator()<>(&local_178,"}\n");
            }
          }
        }
        if ((local_17c & 1) != 0) {
          io::Printer::Outdent(local_178.printer_);
          Formatter::operator()<>(&local_178,"}\n");
        }
        bVar7 = anon_unknown_0::ColdChunkSkipper::OnEndChunk(&local_130,(int)local_1c8,local_210);
        if (bVar7) {
          local_224._0_4_ = -1;
        }
        local_1c8 = local_1c8 + 1;
        uVar14 = ((long)local_1e8.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1e8.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      } while (local_1c8 <= uVar14 && uVar14 - local_1c8 != 0);
    }
    local_208._8_8_ = this_02->descriptor_;
    local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffff00000000);
    local_208._0_4_ = *(undefined4 *)(local_208._8_8_ + 0x6c);
    local_1b0 = (undefined1  [8])local_208._8_8_;
    while (bVar7 = operator==((Iterator *)local_1b8,(Iterator *)local_208), uVar4 = local_224._4_8_,
          !bVar7) {
      Formatter::operator()
                (&local_178,"clear_$1$();\n",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (*(long *)((long)local_1b0 + 0x30) + 8 + (long)(int)local_1b8._0_4_ * 0x28));
      local_1b8._0_4_ = local_1b8._0_4_ + 1;
    }
    if (*(int *)(local_224._4_8_ + 0x1cc) != 0) {
      Formatter::operator()<>(&local_178,"_weak_field_map_.ClearAll();\n");
    }
    if ((((vector<int,_std::allocator<int>_> *)(uVar4 + 0x158))->
        super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start !=
        (((vector<int,_std::allocator<int>_> *)(uVar4 + 0x158))->
        super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish) {
      Formatter::operator()<>(&local_178,"_has_bits_.Clear();\n");
    }
    local_1a8._8_8_ = local_1b0;
    local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffff00000000);
    local_1a8._0_8_ = 0;
    local_1a8._24_8_ = (_Base_ptr)0x0;
    local_1a8._16_8_ = local_1a8._8_8_;
    SetUnknownFieldsVariable
              (*(Descriptor **)uVar4,local_140,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_1b8);
    Formatter::AddMap(&local_178,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_1b8);
    Formatter::operator()<>(&local_178,"_internal_metadata_.Clear<$unknown_fields_type$>();\n");
    io::Printer::Outdent(local_178.printer_);
    Formatter::operator()<>(&local_178,"}\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_1b8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_130.variables_._M_t);
    std::
    vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ::~vector(&local_1e8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_178.vars_._M_t);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClear(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);

  // The maximum number of bytes we will memset to zero without checking their
  // hasbit to see if a zero-init is necessary.
  const int kMaxUnconditionalPrimitiveBytesClear = 4;

  format(
      "void $classname$::Clear() {\n"
      "// @@protoc_insertion_point(message_clear_start:$full_name$)\n");
  format.Indent();

  format(
      // TODO(jwb): It would be better to avoid emitting this if it is not used,
      // rather than emitting a workaround for the resulting warning.
      "$uint32$ cached_has_bits = 0;\n"
      "// Prevent compiler warnings about cached_has_bits being unused\n"
      "(void) cached_has_bits;\n\n");

  if (descriptor_->extension_range_count() > 0) {
    format("_extensions_.Clear();\n");
  }

  // Collect fields into chunks. Each chunk may have an if() condition that
  // checks all hasbits in the chunk and skips it if none are set.
  int zero_init_bytes = 0;
  for (const auto& field : optimized_order_) {
    if (CanInitializeByZeroing(field)) {
      zero_init_bytes += EstimateAlignmentSize(field);
    }
  }
  bool merge_zero_init = zero_init_bytes > kMaxUnconditionalPrimitiveBytesClear;
  int chunk_count = 0;

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        chunk_count++;
        // This predicate guarantees that there is only a single zero-init
        // (memset) per chunk, and if present it will be at the beginning.
        bool same = HasByteIndex(a) == HasByteIndex(b) &&
                    a->is_repeated() == b->is_repeated() &&
                    (CanInitializeByZeroing(a) == CanInitializeByZeroing(b) ||
                     (CanInitializeByZeroing(a) &&
                      (chunk_count == 1 || merge_zero_init)));
        if (!same) chunk_count = 0;
        return same;
      });

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);
  int cached_has_word_index = -1;

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "", printer);

    const FieldDescriptor* memset_start = nullptr;
    const FieldDescriptor* memset_end = nullptr;
    bool saw_non_zero_init = false;

    for (const auto& field : chunk) {
      if (CanInitializeByZeroing(field)) {
        GOOGLE_CHECK(!saw_non_zero_init);
        if (!memset_start) memset_start = field;
        memset_end = field;
      } else {
        saw_non_zero_init = true;
      }
    }

    // Whether we wrap this chunk in:
    //   if (cached_has_bits & <chunk hasbits) { /* chunk. */ }
    // We can omit the if() for chunk size 1, or if our fields do not have
    // hasbits. I don't understand the rationale for the last part of the
    // condition, but it matches the old logic.
    const bool have_outer_if = HasBitIndex(chunk.front()) != kNoHasbit &&
                               chunk.size() > 1 &&
                               (memset_end != chunk.back() || merge_zero_init);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32_t chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = _has_bits_[$1$];\n", cached_has_word_index);
      }
      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    if (memset_start) {
      if (memset_start == memset_end) {
        // For clarity, do not memset a single field.
        field_generators_.get(memset_start)
            .GenerateMessageClearingCode(printer);
      } else {
        format(
            "::memset(&$1$_, 0, static_cast<size_t>(\n"
            "    reinterpret_cast<char*>(&$2$_) -\n"
            "    reinterpret_cast<char*>(&$1$_)) + sizeof($2$_));\n",
            FieldName(memset_start), FieldName(memset_end));
      }
    }

    // Clear all non-zero-initializable fields in the chunk.
    for (const auto& field : chunk) {
      if (CanInitializeByZeroing(field)) continue;
      // It's faster to just overwrite primitive types, but we should only
      // clear strings and messages if they were set.
      //
      // TODO(kenton):  Let the CppFieldGenerator decide this somehow.
      bool have_enclosing_if =
          HasBitIndex(field) != kNoHasbit &&
          (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
           field->cpp_type() == FieldDescriptor::CPPTYPE_STRING);

      if (have_enclosing_if) {
        PrintPresenceCheck(format, field, has_bit_indices_, printer,
                           &cached_has_word_index);
      }

      field_generators_.get(field).GenerateMessageClearingCode(printer);

      if (have_enclosing_if) {
        format.Outdent();
        format("}\n");
      }
    }

    if (have_outer_if) {
      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Step 4: Unions.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("clear_$1$();\n", oneof->name());
  }

  if (num_weak_fields_) {
    format("_weak_field_map_.ClearAll();\n");
  }

  // We don't clear donated status.

  if (!has_bit_indices_.empty()) {
    // Step 5: Everything else.
    format("_has_bits_.Clear();\n");
  }

  std::map<std::string, std::string> vars;
  SetUnknownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);
  format("_internal_metadata_.Clear<$unknown_fields_type$>();\n");

  format.Outdent();
  format("}\n");
}